

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Track::set_codec_id(Track *this,char *codec_id)

{
  size_t __n;
  void *pvVar1;
  char *in_RSI;
  long in_RDI;
  size_t length;
  
  if (in_RSI != (char *)0x0) {
    if (*(void **)(in_RDI + 8) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 8));
    }
    __n = strlen(in_RSI);
    pvVar1 = operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
    *(void **)(in_RDI + 8) = pvVar1;
    if (*(long *)(in_RDI + 8) != 0) {
      memcpy(*(void **)(in_RDI + 8),in_RSI,__n);
      *(undefined1 *)(*(long *)(in_RDI + 8) + __n) = 0;
    }
  }
  return;
}

Assistant:

void Track::set_codec_id(const char* codec_id) {
  if (codec_id) {
    delete[] codec_id_;

    const size_t length = strlen(codec_id) + 1;
    codec_id_ = new (std::nothrow) char[length];  // NOLINT
    if (codec_id_) {
      memcpy(codec_id_, codec_id, length - 1);
      codec_id_[length - 1] = '\0';
    }
  }
}